

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMapKey
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  long lVar1;
  string *psVar2;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Symbol SVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &bStack_b8;
  if (*(int *)(field + 0x30) == 3) {
    if ((*(uint *)(field + 0x2c) & 0xfffffffe) == 10) {
      lVar1 = *(long *)(field + 0x48);
      if (lVar1 == 0) {
        psVar2 = *(string **)(field + 8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bStack_b8,"Could not find field type.",(allocator<char> *)&local_98);
        AddError(this,psVar2,&proto->super_Message,TYPE,&bStack_b8);
        this_00 = &bStack_b8;
      }
      else {
        psVar2 = *(string **)(*(long *)(field + 0x60) + 0x48);
        std::operator+(&local_98,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar1 + 8),".");
        std::operator+(&bStack_b8,&local_98,psVar2);
        local_78 = psVar2;
        SVar4 = LookupSymbol(this,psVar2,&bStack_b8,PLACEHOLDER_MESSAGE,LOOKUP_ALL);
        aVar3 = SVar4.field_1;
        std::__cxx11::string::~string((string *)&bStack_b8);
        std::__cxx11::string::~string((string *)&local_98);
        if ((SVar4.type == NULL_SYMBOL) || (aVar3.descriptor[0x34] == (Descriptor)0x1)) {
          psVar2 = *(string **)(field + 8);
          std::operator+(&local_50,"Could not find field named \"",local_78);
          std::operator+(&local_70,&local_50,"\" in type \"");
          std::operator+(&local_98,&local_70,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (lVar1 + 8));
          std::operator+(&bStack_b8,&local_98,"\".");
          AddError(this,psVar2,&proto->super_Message,TYPE,&bStack_b8);
          std::__cxx11::string::~string((string *)&bStack_b8);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_70);
          this_00 = &local_50;
        }
        else if (*(int *)(aVar3.descriptor + 0x30) == 3) {
          psVar2 = *(string **)(field + 8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&bStack_b8,"map_key must not name a repeated field.",
                     (allocator<char> *)&local_98);
          AddError(this,psVar2,&proto->super_Message,TYPE,&bStack_b8);
          this_00 = &bStack_b8;
        }
        else {
          if ((*(uint *)(aVar3.descriptor + 0x2c) & 0xfffffffe) != 10) {
            ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(field + 0x58))->descriptor =
                 (Descriptor *)aVar3;
            return;
          }
          psVar2 = *(string **)(field + 8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&bStack_b8,"map key must name a scalar or string field.",
                     (allocator<char> *)&local_98);
          AddError(this,psVar2,&proto->super_Message,TYPE,&bStack_b8);
          this_00 = &bStack_b8;
        }
      }
    }
    else {
      psVar2 = *(string **)(field + 8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bStack_b8,"map type is only allowed for fields with a message type.",
                 (allocator<char> *)&local_98);
      AddError(this,psVar2,&proto->super_Message,TYPE,&bStack_b8);
      this_00 = &bStack_b8;
    }
  }
  else {
    psVar2 = *(string **)(field + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bStack_b8,"map type is only allowed for repeated fields.",
               (allocator<char> *)&local_98);
    AddError(this,psVar2,&proto->super_Message,TYPE,&bStack_b8);
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void DescriptorBuilder::ValidateMapKey(FieldDescriptor* field,
                                       const FieldDescriptorProto& proto) {
  if (!field->is_repeated()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map type is only allowed for repeated fields.");
    return;
  }

  if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map type is only allowed for fields with a message type.");
    return;
  }

  const Descriptor* item_type = field->message_type();
  if (item_type == NULL) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Could not find field type.");
    return;
  }

  // Find the field in item_type named by "experimental_map_key"
  const string& key_name = field->options().experimental_map_key();
  const Symbol key_symbol = LookupSymbol(
      key_name,
      // We append ".key_name" to the containing type's name since
      // LookupSymbol() searches for peers of the supplied name, not
      // children of the supplied name.
      item_type->full_name() + "." + key_name);

  if (key_symbol.IsNull() || key_symbol.field_descriptor->is_extension()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Could not find field named \"" + key_name + "\" in type \"" +
             item_type->full_name() + "\".");
    return;
  }
  const FieldDescriptor* key_field = key_symbol.field_descriptor;

  if (key_field->is_repeated()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map_key must not name a repeated field.");
    return;
  }

  if (key_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "map key must name a scalar or string field.");
    return;
  }

  field->experimental_map_key_ = key_field;
}